

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__create_2d__format__hint
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  bool bVar1;
  StringHash SVar2;
  long lVar3;
  xmlChar *text_00;
  xmlChar **ppxVar4;
  bool local_43;
  bool local_42;
  bool local_41;
  int *local_40;
  ParserTemplateBase *local_38;
  
  local_38 = (ParserTemplateBase *)this;
  local_40 = (int *)GeneratedSaxParser::StackMemoryManager::newObject
                              (&(this->
                                super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                                ).super_ParserTemplateBase.mStackMemoryManager,0x18);
  local_40[0] = 7;
  local_40[1] = 6;
  local_40[2] = 0;
  local_40[3] = 0;
  local_40[4] = 0;
  local_40[5] = 0;
  *attributeDataPtr = local_40;
  ppxVar4 = attributes->attributes;
  if ((ppxVar4 != (xmlChar **)0x0) && (text_00 = *ppxVar4, text_00 != (xmlChar *)0x0)) {
    do {
      SVar2 = GeneratedSaxParser::Utils::calculateStringHash(text_00);
      text = ppxVar4[1];
      if ((long)SVar2 < 0xba0e9de) {
        if (SVar2 == 0x7884d5) {
          SVar2 = GeneratedSaxParser::Utils::calculateStringHash(text,&local_42);
          lVar3 = 8;
          do {
            if (*(StringHash *)(&UNK_008372f8 + lVar3) == SVar2) {
              local_40[1] = *(int *)((long)&ENUM__image_format_hint_range_enumMap + lVar3);
              goto LAB_00727234;
            }
            lVar3 = lVar3 + 0x10;
          } while (lVar3 != 0x58);
          local_42 = true;
          local_40[1] = 5;
          SVar2 = 0x7884d5;
          goto LAB_007271f2;
        }
        if (SVar2 == 0x7a6795) {
          *(ParserChar **)(local_40 + 4) = text;
        }
        else {
LAB_0072713b:
          bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                            (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_UNKNOWN_ATTRIBUTE,0x6f054,
                             text_00,text);
          if (bVar1) {
            return false;
          }
        }
      }
      else {
        if (SVar2 == 0xba0e9de) {
          SVar2 = GeneratedSaxParser::Utils::calculateStringHash(text,&local_43);
          lVar3 = 8;
          do {
            if (*(StringHash *)(&UNK_00837348 + lVar3) == SVar2) {
              local_40[2] = *(int *)((long)&ENUM__image_format_hint_precision_enumMap + lVar3);
              goto LAB_00727234;
            }
            lVar3 = lVar3 + 0x10;
          } while (lVar3 != 0x58);
          local_43 = true;
          local_40[2] = 5;
          SVar2 = 0xba0e9de;
        }
        else {
          if (SVar2 != 0xe854ea3) goto LAB_0072713b;
          SVar2 = GeneratedSaxParser::Utils::calculateStringHash(text,&local_41);
          lVar3 = 8;
          do {
            if (*(StringHash *)(&UNK_00837298 + lVar3) == SVar2) {
              *local_40 = *(int *)((long)&ENUM__image_format_hint_channels_enumMap + lVar3);
              goto LAB_00727234;
            }
            lVar3 = lVar3 + 0x10;
          } while (lVar3 != 0x68);
          local_41 = true;
          *local_40 = 6;
          SVar2 = 0xe854ea3;
        }
LAB_007271f2:
        bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                          (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_ATTRIBUTE_PARSING_FAILED,
                           0x6f054,SVar2,text);
        if (bVar1) {
          return false;
        }
      }
LAB_00727234:
      ppxVar4 = ppxVar4 + 2;
      text_00 = *ppxVar4;
    } while (text_00 != (xmlChar *)0x0);
    if (*local_40 != 7) goto LAB_00727275;
  }
  bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                    (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_REQUIRED_ATTRIBUTE_MISSING,0x6f054,
                     0xe854ea3,(ParserChar *)0x0);
  if (bVar1) {
    return false;
  }
LAB_00727275:
  if ((local_40[1] == 6) &&
     (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_REQUIRED_ATTRIBUTE_MISSING,
                         0x6f054,0x7884d5,(ParserChar *)0x0), bVar1)) {
    return false;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__create_2d__format__hint( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__create_2d__format__hint( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

create_2d__format__hint__AttributeData* attributeData = newData<create_2d__format__hint__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_CHANNELS:
    {
bool failed;
attributeData->channels = Utils::toEnum<ENUM__image_format_hint_channels_enum, StringHash, ENUM__image_format_hint_channels_enum__COUNT>(attributeValue, failed, ENUM__image_format_hint_channels_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_HINT,
        HASH_ATTRIBUTE_CHANNELS,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_RANGE:
    {
bool failed;
attributeData->range = Utils::toEnum<ENUM__image_format_hint_range_enum, StringHash, ENUM__image_format_hint_range_enum__COUNT>(attributeValue, failed, ENUM__image_format_hint_range_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_HINT,
        HASH_ATTRIBUTE_RANGE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_PRECISION:
    {
bool failed;
attributeData->precision = Utils::toEnum<ENUM__image_format_hint_precision_enum, StringHash, ENUM__image_format_hint_precision_enum__COUNT>(attributeValue, failed, ENUM__image_format_hint_precision_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_HINT,
        HASH_ATTRIBUTE_PRECISION,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_SPACE:
    {

attributeData->space = attributeValue;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_HINT, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( attributeData->channels == ENUM__image_format_hint_channels_enum__NOT_PRESENT )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_HINT, HASH_ATTRIBUTE_CHANNELS, 0 ) )
        return false;
}
if ( attributeData->range == ENUM__image_format_hint_range_enum__NOT_PRESENT )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_HINT, HASH_ATTRIBUTE_RANGE, 0 ) )
        return false;
}


    return true;
}